

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall
Js::ByteCodeWriter::Auxiliary
          (ByteCodeWriter *this,OpCode op,RegSlot destinationRegister,uint byteOffset,int C1)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  undefined6 in_register_00000032;
  uint local_40;
  int local_3c;
  OpLayoutAuxiliary data;
  
  data.super_OpLayoutAuxNoReg.C1 = (int32)CONCAT62(in_register_00000032,op);
  CheckOpen(this);
  if (destinationRegister != 0xffffffff) {
    if (this->m_functionWrite == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_008a38d8;
      *puVar3 = 0;
    }
    data.super_OpLayoutAuxNoReg.Offset =
         FunctionBody::MapRegSlot(this->m_functionWrite,destinationRegister);
    if ((this->m_auxiliaryData).currentOffset <= byteOffset) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0xa01,"(byteOffset < m_auxiliaryData.GetCurrentOffset())",
                                  "byteOffset < m_auxiliaryData.GetCurrentOffset()");
      if (!bVar2) goto LAB_008a38d8;
      *puVar3 = 0;
    }
    local_40 = byteOffset;
    local_3c = C1;
    Data::EncodeT<(Js::LayoutSize)0>
              (&this->m_byteCodeData,(OpCode)data.super_OpLayoutAuxNoReg.C1,this);
    Data::Write(&this->m_byteCodeData,&local_40,0xc);
    return;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar3 = 0;
    Throw::InternalError();
  }
LAB_008a38d8:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::Auxiliary(OpCode op, RegSlot destinationRegister, uint byteOffset, int C1)
    {
        CheckOpen();
        destinationRegister = ConsumeReg(destinationRegister);

        //
        // Write the buffer's contents
        //

        Assert(byteOffset < m_auxiliaryData.GetCurrentOffset());

        OpLayoutAuxiliary data;
        data.R0 = destinationRegister;
        data.Offset = byteOffset;
        data.C1 = C1;

        m_byteCodeData.Encode(op, &data, sizeof(data), this);
    }